

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourcePositional::IfcLightSourcePositional
          (IfcLightSourcePositional *this,void **vtt)

{
  void **vtt_local;
  IfcLightSourcePositional *this_local;
  
  IfcLightSource::IfcLightSource(&this->super_IfcLightSource,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourcePositional,_5UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourcePositional,_5UL> *)
             &(this->super_IfcLightSource).field_0x80,vtt + 0x10);
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
                    super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
                  super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x13];
  *(void **)&(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x14];
  *(void **)&(this->super_IfcLightSource).field_0x80 = vtt[0x15];
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint> *)
             &(this->super_IfcLightSource).field_0x90,(LazyObject *)0x0);
  return;
}

Assistant:

IfcLightSourcePositional() : Object("IfcLightSourcePositional") {}